

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_4,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  long lVar1;
  Vector<float,_3> *in_RCX;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Vector<float,_4> local_c0;
  float local_b0 [4];
  float local_a0 [2];
  undefined8 local_98;
  undefined4 local_90;
  float local_88 [4];
  float local_78 [4];
  float local_68 [4];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Matrix<float,_4,_3> local_40;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_58 = (evalCtx->coords).m_data[0];
    fStack_54 = (evalCtx->coords).m_data[1];
    fStack_50 = (evalCtx->coords).m_data[2];
    fStack_4c = (evalCtx->coords).m_data[3];
  }
  else {
    local_58 = (float)0x3fb33333;
    fStack_54 = (float)0x3e4ccccd;
    fStack_50 = (float)0xbf000000;
    fStack_4c = (float)0x3f333333;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_c0.m_data[2] = (evalCtx->coords).m_data[2];
    local_c0.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    local_c0.m_data[0] = -0.2;
    local_c0.m_data[1] = 0.5;
    local_c0.m_data[2] = 0.8;
  }
  outerProduct<float,3,4>(&local_40,(MatrixCaseUtils *)&local_58,&local_c0,in_RCX);
  local_68[0] = local_40.m_data.m_data[0].m_data[0];
  local_68[1] = local_40.m_data.m_data[0].m_data[1];
  local_68[2] = local_40.m_data.m_data[0].m_data[2];
  local_78[0] = local_40.m_data.m_data[1].m_data[1];
  local_78[1] = local_40.m_data.m_data[1].m_data[2];
  local_78[2] = local_40.m_data.m_data[1].m_data[3];
  local_a0[0] = 0.0;
  local_a0[1] = 0.0;
  local_98 = (ulong)local_98._4_4_ << 0x20;
  lVar1 = 0;
  do {
    local_a0[lVar1] = local_68[lVar1] + local_78[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_88[0] = local_40.m_data.m_data[2].m_data[2];
  local_88[1] = local_40.m_data.m_data[2].m_data[3];
  local_88[2] = local_40.m_data.m_data[2].m_data[0];
  local_b0[0] = 0.0;
  local_b0[1] = 0.0;
  local_b0[2] = 0.0;
  lVar1 = 0;
  do {
    local_b0[lVar1] = local_a0[lVar1] + local_88[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  local_98 = 0x100000000;
  local_90 = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[(int)local_a0[lVar1]] = local_c0.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}